

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O2

void hyperplane_internal(int ndims,int *dims,int *original_grid_dimensions,int *grid_points,
                        int n_nodes,int n_processes_p_node,int my_rank,int *new_rank_coords,
                        int my_partition,double *angle_values,int grid_size,int *dimension_order,
                        int partition_id)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int local_64;
  
  local_64 = partition_id;
  uVar5 = 0;
  if (0 < ndims) {
    uVar5 = (ulong)(uint)ndims;
  }
LAB_0014b495:
  hyperplane_dimension_order(angle_values,dims,ndims,dimension_order);
  if (grid_size <= n_processes_p_node * 2) {
    base_case_new_coord_calculation
              (ndims,my_rank,local_64,n_processes_p_node,grid_points,new_rank_coords,dimension_order
              );
    return;
  }
  uVar12 = 0;
  do {
    if (uVar12 == uVar5) {
      return;
    }
    iVar1 = dimension_order[uVar12];
    iVar4 = dims[iVar1];
    if (iVar4 != 1) {
      if (n_processes_p_node == 0) {
        __assert_fail("n_processes_p_node != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/reordering_algorithms/hyperplane/hyperplane.cpp"
                      ,0x8e,
                      "void hyperplane_internal(const int, int *, const int *, int *, const int, const int, const int, int *, const int, const double *, int, int *, int)"
                     );
      }
      if (iVar4 == 0) {
        __assert_fail("dims[best_dimension_index] != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/reordering_algorithms/hyperplane/hyperplane.cpp"
                      ,0x8f,
                      "void hyperplane_internal(const int, int *, const int *, int *, const int, const int, const int, int *, const int, const double *, int, int *, int)"
                     );
      }
      iVar6 = grid_size / iVar4;
      iVar3 = (int)((long)iVar4 / 2);
      iVar11 = iVar6 * iVar3;
      uVar8 = (long)iVar4 / 2 & 0xffffffff;
      for (iVar9 = (iVar4 - iVar3) * iVar6;
          ((iVar7 = (int)uVar8, iVar11 % n_processes_p_node != 0 && (1 < iVar7)) &&
          (iVar9 % n_processes_p_node != 0)); iVar9 = iVar9 + iVar6) {
        uVar8 = (ulong)(iVar7 - 1);
        iVar11 = iVar11 - iVar6;
      }
      uVar2 = iVar1 * 2;
      iVar9 = grid_points[(int)uVar2];
      iVar11 = iVar4 - iVar7;
      if (iVar3 + iVar9 < original_grid_dimensions[iVar1] / 2) {
        iVar11 = iVar7;
      }
      iVar10 = iVar11 * iVar6;
      if (iVar10 % n_processes_p_node == 0) {
        if (iVar3 + iVar9 < original_grid_dimensions[iVar1] / 2) {
          iVar7 = iVar4 - iVar7;
        }
        if ((iVar6 * iVar7) % n_processes_p_node == 0) break;
      }
    }
    uVar12 = uVar12 + 1;
  } while( true );
  iVar4 = iVar10 / n_processes_p_node + local_64;
  if (my_partition < iVar4) {
    grid_points[(int)(uVar2 | 1)] = iVar11 + iVar9 + -1;
    dims[iVar1] = iVar11;
    grid_size = iVar10;
  }
  else {
    grid_points[(int)uVar2] = iVar11 + iVar9;
    dims[iVar1] = iVar7;
    grid_size = iVar6 * iVar7;
    local_64 = iVar4;
  }
  goto LAB_0014b495;
}

Assistant:

void hyperplane_internal(const int ndims,
			 int dims[],
			 const int original_grid_dimensions[],
			 int grid_points[],
			 const int n_nodes,
			 const int n_processes_p_node,
			 const int my_rank,
			 int new_rank_coords[],
			 const int my_partition,
			 const double angle_values[],
			 int grid_size,
			 int dimension_order[],
			 int partition_id) {
  hyperplane_dimension_order(angle_values, dims, ndims, dimension_order);
  //Entering base case is either having two
  //nodes or one and then fill it up
  if (grid_size <= 2 * n_processes_p_node) {
	base_case_new_coord_calculation(ndims,
					my_rank,
					partition_id,
					n_processes_p_node,
					grid_points,
					new_rank_coords,
					dimension_order);

	return;
  }

  //Find the split and recurse
  //O ( ndims)
  int best_dimension_index;
  for (int i{0}; i < ndims; i++) {
	best_dimension_index = dimension_order[i];
	if (dims[best_dimension_index] == 1) {
	  continue;
	}

	assert(n_processes_p_node != 0);
	assert(dims[best_dimension_index] != 0);
	//Try to split s.t both sides are a multiple of the number of processes on a node
	int subvolume = grid_size / dims[best_dimension_index];

	//Initial positioning of hyperplane
	int split_lhs, split_rhs;
	split_lhs = dims[best_dimension_index] / 2;
	split_rhs = dims[best_dimension_index] - split_lhs;

	//Try to find split along dimension with balanced sizes
	//O( dims[best_dimension_index] )
	while ((subvolume * split_lhs) % n_processes_p_node != 0 &&
		(subvolume * split_rhs) % n_processes_p_node != 0 && split_lhs > 1) {
	  split_lhs -= 1;
	  split_rhs += 1;
	}

	//swap the two variables if the leftside of the subgrid is closer to right boundary
	if (grid_points[2 * best_dimension_index] + dims[best_dimension_index] / 2 >=
		original_grid_dimensions[best_dimension_index] / 2) {
	  int tmp = split_rhs;
	  split_rhs = split_lhs;
	  split_lhs = tmp;
	}

	//If partition was found, recurse
	if (subvolume * split_lhs % n_processes_p_node == 0 &&
		subvolume * split_rhs % n_processes_p_node == 0) {
	  //Adjust and enter the recursion
	  int remaining_partitions = subvolume * split_lhs / n_processes_p_node;

	  //case for the left hand side
	  if (my_partition < partition_id + remaining_partitions) {
		//adjust the grid points left hand side
		grid_points[2 * best_dimension_index + 1] = grid_points[2 * best_dimension_index] + split_lhs - 1;

		//adjust the dimensions left hand side
		dims[best_dimension_index] = split_lhs;

		hyperplane_internal(ndims, dims,
					original_grid_dimensions,
					grid_points,
					n_nodes,
					n_processes_p_node,
					my_rank,
					new_rank_coords,
					my_partition,
					angle_values,
					subvolume * split_lhs,
					dimension_order,
					partition_id);
	  }
		//case for the right hand side
	  else {
		//adjust the grid points rhs
		grid_points[2 * best_dimension_index] = grid_points[2 * best_dimension_index] + split_lhs;
		//adjust the dimesion size rhs
		dims[best_dimension_index] = split_rhs;

		hyperplane_internal(ndims, dims,
				original_grid_dimensions,
				grid_points, n_nodes,
				n_processes_p_node,
				my_rank,
				new_rank_coords,
				my_partition,
				angle_values,
				subvolume * split_rhs,
				dimension_order,
				partition_id + remaining_partitions);
	  }
	  //Exit for loop!
	  break;
	}
  }
}